

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O3

void __thiscall chrono::curiosity::Curiosity::Update(Curiosity *this)

{
  undefined8 uVar1;
  double dVar2;
  element_type *peVar3;
  bool bVar4;
  int iVar5;
  bool bVar6;
  long lVar7;
  double dVar8;
  
  uVar1 = *(undefined8 *)(this->m_system + 0x1a8);
  (*((this->m_driver).
     super___shared_ptr<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_CuriosityDriver[3])();
  iVar5 = (*((this->m_driver).
             super___shared_ptr<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_CuriosityDriver[2])();
  if (iVar5 == 0) {
    lVar7 = 0;
    do {
      (**(code **)(**(long **)((long)&(this->m_drive_motor_funcs)._M_elems[0].
                                      super___shared_ptr<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + lVar7 * 2) + 0xd0))
                (*(undefined8 *)
                  ((long)(((this->m_driver).
                           super___shared_ptr<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->drive_speeds)._M_elems + lVar7),uVar1);
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x30);
  }
  peVar3 = (this->m_driver).
           super___shared_ptr<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  lVar7 = 0;
  bVar4 = true;
  do {
    bVar6 = bVar4;
    dVar2 = (peVar3->steer_angles)._M_elems[lVar7];
    dVar8 = -1.4835298641951802;
    if ((-1.4835298641951802 <= dVar2) && (dVar8 = dVar2, 1.4835298641951802 < dVar2)) {
      dVar8 = 1.4835298641951802;
    }
    *(double *)
     ((this->m_rocker_motor_funcs)._M_elems[lVar7].
      super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8) = dVar8;
    lVar7 = 1;
    bVar4 = false;
  } while (bVar6);
  lVar7 = 0;
  bVar4 = true;
  do {
    bVar6 = bVar4;
    dVar2 = (peVar3->steer_angles)._M_elems[lVar7 + 2];
    dVar8 = -1.4835298641951802;
    if ((-1.4835298641951802 <= dVar2) && (dVar8 = dVar2, 1.4835298641951802 < dVar2)) {
      dVar8 = 1.4835298641951802;
    }
    *(double *)
     ((this->m_bogie_motor_funcs)._M_elems[lVar7].
      super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8) = dVar8;
    lVar7 = 1;
    bVar4 = false;
  } while (bVar6);
  return;
}

Assistant:

void Curiosity::Update() {
    double time = m_system->GetChTime();
    m_driver->Update(time);

    if (m_driver->GetDriveMotorType() == CuriosityDriver::DriveMotorType::SPEED) {
        for (int i = 0; i < 6; i++) {
            double driving = m_driver->drive_speeds[i];
            m_drive_motor_funcs[i]->SetSetpoint(driving, time);
        }
    }

    for (int i = 0; i < 2; i++) {
        double steering = m_driver->steer_angles[i];
        // Enforce maximum steering angle
        ChClampValue(steering, -max_steer_angle, +max_steer_angle);
        m_rocker_motor_funcs[i]->Set_yconst(steering);
    }

    for (int i = 0; i < 2; i++) {
        double steering = m_driver->steer_angles[i + 2];
        // Enforce maximum steering angle
        ChClampValue(steering, -max_steer_angle, +max_steer_angle);
        m_bogie_motor_funcs[i]->Set_yconst(steering);
    }
}